

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::ZoneVector<asmjit::v1_14::Pass_*>::append
          (ZoneVector<asmjit::v1_14::Pass_*> *this,ZoneAllocator *allocator,Pass **item)

{
  uint uVar1;
  Error EVar2;
  
  uVar1 = *(uint *)(this + 8);
  if (uVar1 == *(uint *)(this + 0xc)) {
    EVar2 = ZoneVectorBase::_grow((ZoneVectorBase *)this,allocator,8,1);
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar1 = *(uint *)(this + 8);
  }
  *(Pass **)(*(long *)this + (ulong)uVar1 * 8) = *item;
  *(int *)(this + 8) = *(int *)(this + 8) + 1;
  return 0;
}

Assistant:

ASMJIT_FORCE_INLINE Error append(ZoneAllocator* allocator, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_size == _capacity))
      ASMJIT_PROPAGATE(grow(allocator, 1));

    memcpy(static_cast<void*>(static_cast<T*>(_data) + _size),
           static_cast<const void*>(&item),
           sizeof(T));

    _size++;
    return kErrorOk;
  }